

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QList<QUrl> *
QFileDialog::getOpenFileUrls
          (QWidget *parent,QString *caption,QUrl *dir,QString *filter,QString *selectedFilter,
          Options options,QStringList *supportedSchemes)

{
  bool bVar1;
  int iVar2;
  QFileDialog *pQVar3;
  QFileDialog *in_RCX;
  QFileDialog *in_RDX;
  QFileDialogArgs *in_RDI;
  QFileDialog *in_R8;
  QFileDialogArgs *in_R9;
  long in_FS_OFFSET;
  undefined4 in_stack_00000008;
  int execResult;
  QAutoPointer<QFileDialog> dialog;
  QFileDialogArgs args;
  QFileDialogArgs *this;
  QUrl *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  QFileDialogArgs *filter_00;
  QFileDialog *in_stack_ffffffffffffff68;
  undefined1 local_70 [8];
  QString aQStack_68 [2];
  QString QStack_30;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_stack_00000008;
  this = in_RDI;
  filter_00 = in_RDI;
  memset(local_70,0xaa,0x60);
  QFileDialogArgs::QFileDialogArgs
            ((QFileDialogArgs *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  QString::operator=(aQStack_68,(QString *)in_RDX);
  QString::operator=(&QStack_30,(QString *)in_R8);
  local_18 = 3;
  local_14 = local_c;
  operator_new(0x28);
  QFileDialog(in_R8,in_R9);
  QAutoPointer<QFileDialog>::QAutoPointer((QAutoPointer<QFileDialog> *)this,(QFileDialog *)in_RDI);
  QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x75a215);
  setSupportedSchemes((QFileDialog *)this,(QStringList *)in_RDI);
  if ((in_R9 != (QFileDialogArgs *)0x0) && (bVar1 = QString::isEmpty((QString *)0x75a237), !bVar1))
  {
    QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x75a245);
    selectNameFilter(in_stack_ffffffffffffff68,(QString *)filter_00);
  }
  pQVar3 = QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x75a25c);
  iVar2 = (**(code **)(*(long *)&(pQVar3->super_QDialog).super_QWidget + 0x1a8))();
  bVar1 = QAutoPointer::operator_cast_to_bool((QAutoPointer<QFileDialog> *)0x75a276);
  if ((bVar1) && (iVar2 == 1)) {
    if (in_R9 != (QFileDialogArgs *)0x0) {
      QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x75a295);
      selectedNameFilter(in_RDX);
      QString::operator=((QString *)this,(QString *)in_RDI);
      QString::~QString((QString *)0x75a2bb);
    }
    QAutoPointer<QFileDialog>::operator->((QAutoPointer<QFileDialog> *)0x75a2c5);
    selectedUrls(in_RCX);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QUrl>::QList((QList<QUrl> *)0x75a2f4);
  }
  QAutoPointer<QFileDialog>::~QAutoPointer((QAutoPointer<QFileDialog> *)this);
  QFileDialogArgs::~QFileDialogArgs(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QUrl> *)this;
}

Assistant:

QList<QUrl> QFileDialog::getOpenFileUrls(QWidget *parent,
                                         const QString &caption,
                                         const QUrl &dir,
                                         const QString &filter,
                                         QString *selectedFilter,
                                         Options options,
                                         const QStringList &supportedSchemes)
{
    QFileDialogArgs args(dir);
    args.parent = parent;
    args.caption = caption;
    args.filter = filter;
    args.mode = ExistingFiles;
    args.options = options;

    QAutoPointer<QFileDialog> dialog(new QFileDialog(args));
    dialog->setSupportedSchemes(supportedSchemes);
    if (selectedFilter && !selectedFilter->isEmpty())
        dialog->selectNameFilter(*selectedFilter);
    const int execResult = dialog->exec();
    if (bool(dialog) && execResult == QDialog::Accepted) {
        if (selectedFilter)
            *selectedFilter = dialog->selectedNameFilter();
        return dialog->selectedUrls();
    }
    return QList<QUrl>();
}